

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::removeFromMaps(Connection *this)

{
  bool bVar1;
  byte bVar2;
  LogStringBuffer *buffer_00;
  long lVar3;
  long in_RDI;
  uint32_t probeKey;
  UDPAddress addr;
  bool success;
  Locker locker;
  Locker locker_1;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  Lock *in_stack_fffffffffffff4f8;
  LogStringBuffer *in_stack_fffffffffffff500;
  IConnection *in_stack_fffffffffffff508;
  uint *in_stack_fffffffffffff510;
  undefined1 *puVar4;
  ConnectionMap<unsigned_int,_tonk::UInt32Hasher> *in_stack_fffffffffffff518;
  IConnection *in_stack_fffffffffffff528;
  id_t in_stack_fffffffffffff534;
  LogStringBuffer *in_stack_fffffffffffff538;
  OutputWorker *in_stack_fffffffffffff540;
  IConnection *in_stack_fffffffffffff558;
  UDPAddress *in_stack_fffffffffffff560;
  ConnectionAddrMap *in_stack_fffffffffffff568;
  uint local_a08 [5];
  unsigned_short local_9f2 [17];
  string local_9d0 [32];
  undefined1 local_9b0 [31];
  byte local_991;
  LogStringBuffer *local_988;
  uint local_980;
  long local_968;
  undefined1 *local_960;
  uint *local_958;
  char *local_950;
  long local_948;
  ushort *local_940;
  char *local_938;
  string *local_930;
  char *local_928;
  long local_920;
  uint local_8f4;
  undefined8 local_8f0;
  uint *local_8e8;
  char *local_8e0;
  long local_8d8;
  uint *local_8d0;
  char *local_8c8;
  undefined4 local_8bc;
  long local_8b8;
  undefined4 local_8ac;
  long local_8a8;
  undefined1 local_890 [16];
  ostream aoStack_880 [376];
  uint *local_708;
  char *local_700;
  undefined4 local_6f4;
  long local_6f0;
  uint *local_6e8;
  char *local_6e0;
  string *local_6d8;
  undefined1 *local_6d0;
  long local_6c8;
  string *local_6c0;
  undefined1 *local_6b8;
  long local_6b0;
  string *local_6a8;
  undefined1 *local_6a0;
  uint *local_698;
  char *local_690;
  undefined1 *local_688;
  long local_680;
  uint *local_678;
  undefined1 *local_670;
  long local_668;
  uint *local_660;
  undefined1 *local_658;
  char *local_650;
  undefined1 *local_648;
  long local_640;
  char *local_638;
  undefined1 *local_630;
  ushort *local_628;
  char *local_620;
  string *local_618;
  char *local_610;
  undefined4 local_604;
  long local_600;
  undefined4 local_5f4;
  long local_5f0;
  undefined1 local_5d8 [16];
  ostream aoStack_5c8 [376];
  ushort *local_450;
  char *local_448;
  string *local_440;
  char *local_438;
  undefined4 local_42c;
  long local_428;
  ushort *local_420;
  char *local_418;
  string *local_410;
  char *local_408;
  string *local_400;
  undefined1 *local_3f8;
  long local_3f0;
  string *local_3e8;
  undefined1 *local_3e0;
  long local_3d8;
  string *local_3d0;
  undefined1 *local_3c8;
  ushort *local_3c0;
  char *local_3b8;
  string *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  long local_398;
  ushort *local_390;
  char *local_388;
  string *local_380;
  undefined1 *local_378;
  long local_370;
  string *local_368;
  undefined1 *local_360;
  long local_358;
  string *local_350;
  undefined1 *local_348;
  ushort *local_340;
  char *local_338;
  undefined1 *local_330;
  long local_328;
  ushort *local_320;
  undefined1 *local_318;
  long local_310;
  ushort *local_308;
  undefined1 *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  long local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  long local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  uint *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  long local_290;
  undefined4 local_284;
  long local_280;
  undefined1 local_268 [392];
  uint *local_e0;
  char *local_d8;
  undefined4 local_cc;
  long local_c8;
  uint *local_c0;
  char *local_b8;
  string *local_b0;
  undefined1 *local_a8;
  long local_a0;
  string *local_98;
  undefined1 *local_90;
  long local_88;
  string *local_80;
  undefined1 *local_78;
  uint *local_70;
  char *local_68;
  undefined1 *local_60;
  long local_58;
  char *local_50;
  undefined1 *local_48;
  long local_40;
  uint *local_38;
  undefined1 *local_30;
  long local_28;
  uint *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  if ((*(byte *)(in_RDI + 0xc924) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0xc924) = 1;
    local_991 = ConnectionIdMap::RemoveAndUnassignId
                          ((ConnectionIdMap *)in_stack_fffffffffffff538,in_stack_fffffffffffff534,
                           in_stack_fffffffffffff528);
    if (!(bool)local_991) {
      lVar3 = in_RDI + 0x110;
      local_958 = (uint *)(in_RDI + 0xc900);
      local_950 = "Unable to remove/unassign id=";
      local_8bc = 3;
      local_8c8 = "Unable to remove/unassign id=";
      local_8ac = 3;
      local_948 = lVar3;
      local_8d0 = local_958;
      local_8b8 = lVar3;
      local_8a8 = lVar3;
      if (*(int *)(in_RDI + 0x118) < 4) {
        local_6f4 = 3;
        local_700 = "Unable to remove/unassign id=";
        local_708 = local_958;
        local_6f0 = lVar3;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,Trace);
        local_6d8 = (string *)(in_RDI + 0x148);
        local_6e0 = local_700;
        local_6e8 = local_708;
        local_6d0 = local_890;
        local_6c8 = lVar3;
        local_6c0 = local_6d8;
        local_6b8 = local_890;
        local_6b0 = lVar3;
        local_6a8 = local_6d8;
        local_6a0 = local_890;
        std::operator<<(aoStack_880,local_6d8);
        local_688 = local_6d0;
        local_690 = local_6e0;
        local_698 = local_6e8;
        local_648 = local_6d0;
        local_650 = local_6e0;
        local_630 = local_6d0;
        local_638 = local_6e0;
        local_680 = lVar3;
        local_640 = lVar3;
        std::operator<<((ostream *)(local_6d0 + 0x10),local_6e0);
        local_670 = local_688;
        local_678 = local_698;
        local_658 = local_688;
        local_660 = local_698;
        local_668 = lVar3;
        std::ostream::operator<<((ostream *)(local_688 + 0x10),*local_698);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1a5e55);
      }
    }
    local_968 = in_RDI + 0x168;
    local_960 = local_9b0;
    Locker::Locker((Locker *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
    asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
              ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff500,
               (basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff4f8);
    Locker::~Locker((Locker *)0x1a5f0a);
    local_991 = ConnectionAddrMap::RemoveAddress
                          (in_stack_fffffffffffff568,in_stack_fffffffffffff560,
                           in_stack_fffffffffffff558);
    if (!(bool)local_991) {
      lVar3 = in_RDI + 0x110;
      asio::ip::basic_endpoint<asio::ip::udp>::address
                ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff4f8);
      asio::ip::address::to_string_abi_cxx11_((address *)in_stack_fffffffffffff508);
      local_9f2[0] = asio::ip::basic_endpoint<asio::ip::udp>::port
                               ((basic_endpoint<asio::ip::udp> *)0x1a5f9a);
      local_928 = "Unable to remove/unassign address ";
      local_930 = local_9d0;
      local_938 = ":";
      local_940 = local_9f2;
      local_604 = 3;
      local_610 = "Unable to remove/unassign address ";
      local_620 = ":";
      local_5f4 = 3;
      local_920 = lVar3;
      local_628 = local_940;
      local_618 = local_930;
      local_600 = lVar3;
      local_5f0 = lVar3;
      if (*(int *)(in_RDI + 0x118) < 4) {
        local_42c = 3;
        local_438 = "Unable to remove/unassign address ";
        local_448 = ":";
        local_450 = local_940;
        local_440 = local_930;
        local_428 = lVar3;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,Trace);
        local_400 = (string *)(in_RDI + 0x148);
        local_3f8 = local_5d8;
        local_408 = local_438;
        local_410 = local_440;
        local_418 = local_448;
        local_420 = local_450;
        local_3f0 = lVar3;
        local_3e8 = local_400;
        local_3e0 = local_3f8;
        local_3d8 = lVar3;
        local_3d0 = local_400;
        local_3c8 = local_3f8;
        std::operator<<(aoStack_5c8,local_400);
        local_3a0 = local_3f8;
        local_3a8 = local_408;
        local_3b0 = local_410;
        local_3b8 = local_418;
        local_3c0 = local_420;
        local_2c8 = local_3f8;
        local_2d0 = local_408;
        local_2b0 = local_3f8;
        local_2b8 = local_408;
        local_398 = lVar3;
        local_2c0 = lVar3;
        std::operator<<((ostream *)(local_3f8 + 0x10),local_408);
        local_378 = local_3a0;
        local_380 = local_3b0;
        local_388 = local_3b8;
        local_390 = local_3c0;
        local_360 = local_3a0;
        local_368 = local_3b0;
        local_348 = local_3a0;
        local_350 = local_3b0;
        local_370 = lVar3;
        local_358 = lVar3;
        std::operator<<((ostream *)(local_3a0 + 0x10),local_3b0);
        local_330 = local_378;
        local_338 = local_388;
        local_340 = local_390;
        local_2f0 = local_378;
        local_2f8 = local_388;
        local_2d8 = local_378;
        local_2e0 = local_388;
        local_328 = lVar3;
        local_2e8 = lVar3;
        std::operator<<((ostream *)(local_378 + 0x10),local_388);
        local_318 = local_330;
        local_320 = local_340;
        local_300 = local_330;
        local_308 = local_340;
        local_310 = lVar3;
        std::ostream::operator<<((ostream *)(local_330 + 0x10),*local_340);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1a6513);
      }
      std::__cxx11::string::~string(local_9d0);
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>
                        *)0x1a6576);
    if (bVar1) {
      buffer_00 = (LogStringBuffer *)
                  std::unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>
                  ::operator->((unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>
                                *)0x1a6593);
      if ((((P2PConnectParams *)&buffer_00->ChannelName)->WinTies & 1U) == 0) {
        local_980 = (uint)(*(uint64_t *)&buffer_00->LogLevel >> 0x20);
      }
      else {
        local_980 = (uint)*(uint64_t *)&buffer_00->LogLevel;
      }
      local_a08[0] = local_980;
      local_8f0 = *(undefined8 *)(in_RDI + 0x90);
      local_8f4 = local_980;
      local_988 = buffer_00;
      Locker::Locker((Locker *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
      bVar2 = ConnectionMap<unsigned_int,_tonk::UInt32Hasher>::Remove
                        (in_stack_fffffffffffff518,in_stack_fffffffffffff510,
                         in_stack_fffffffffffff508);
      Locker::~Locker((Locker *)0x1a6693);
      local_991 = bVar2 & 1;
      if (local_991 == 0) {
        lVar3 = in_RDI + 0x110;
        local_8e0 = "Unable to remove/unassign P2PKey=";
        local_8e8 = local_a08;
        local_294 = 3;
        local_2a0 = "Unable to remove/unassign P2PKey=";
        local_284 = 3;
        if (*(int *)(in_RDI + 0x118) < 4) {
          local_cc = 3;
          local_d8 = "Unable to remove/unassign P2PKey=";
          puVar4 = local_268;
          local_8d8 = lVar3;
          local_2a8 = local_8e8;
          local_290 = lVar3;
          local_280 = lVar3;
          local_e0 = local_8e8;
          local_c8 = lVar3;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,Trace);
          local_b0 = (string *)(lVar3 + 0x38);
          local_b8 = local_d8;
          local_c0 = local_e0;
          local_a8 = puVar4;
          local_a0 = lVar3;
          local_98 = local_b0;
          local_90 = puVar4;
          local_88 = lVar3;
          local_80 = local_b0;
          local_78 = puVar4;
          std::operator<<((ostream *)(puVar4 + 0x10),local_b0);
          local_60 = local_a8;
          local_68 = local_b8;
          local_70 = local_c0;
          local_48 = local_a8;
          local_50 = local_b8;
          local_8 = local_a8;
          local_10 = local_b8;
          local_58 = lVar3;
          local_40 = lVar3;
          std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
          local_30 = local_60;
          local_38 = local_70;
          local_18 = local_60;
          local_20 = local_70;
          local_28 = lVar3;
          std::ostream::operator<<((ostream *)(local_60 + 0x10),*local_70);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_fffffffffffff540,buffer_00);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1a69f5);
        }
      }
    }
  }
  return;
}

Assistant:

void Connection::removeFromMaps()
{
    if (RemovedFromMaps) {
        return;
    }
    RemovedFromMaps = true;

    // Make sure that the maps do not contain the Connection
    bool success = Deps.IdMap->RemoveAndUnassignId(LocallyAssignedIdForRemoteHost, this);
    if (!success) {
        Logger.Warning("Unable to remove/unassign id=", LocallyAssignedIdForRemoteHost);
    }

    const UDPAddress addr = Outgoing.GetPeerUDPAddress();
    success = Deps.AddressMap->RemoveAddress(addr, this);
    if (!success) {
        Logger.Warning("Unable to remove/unassign address ", addr.address().to_string(), ":", addr.port());
    }

    if (HolePuncher) {
        const uint32_t probeKey = HolePuncher->StartParams.GetExpectedIncomingProbeKey();
        success = Deps.P2PKeyMap->RemoveByKey(probeKey, this);
        if (!success) {
            Logger.Warning("Unable to remove/unassign P2PKey=", probeKey);
        }
    }
}